

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O2

BOOL __thiscall
Js::DynamicObject::ToPrimitive
          (DynamicObject *this,JavascriptHint hint,Var *result,ScriptContext *requestContext)

{
  code *pcVar1;
  BOOL BVar2;
  int iVar3;
  undefined4 *puVar4;
  bool bVar5;
  
  if (hint == HintString) {
    BVar2 = ToPrimitiveImpl<376>(this,result,requestContext);
    bVar5 = true;
    if (BVar2 != 0) goto LAB_00c3e2fb;
    iVar3 = ToPrimitiveImpl<398>(this,result,requestContext);
  }
  else {
    if ((hint & ~HintNumber) != None) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0x18c,
                                  "(hint == JavascriptHint::None || hint == JavascriptHint::HintNumber)"
                                  ,
                                  "hint == JavascriptHint::None || hint == JavascriptHint::HintNumber"
                                 );
      if (!bVar5) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    BVar2 = ToPrimitiveImpl<398>(this,result,requestContext);
    bVar5 = true;
    if (BVar2 != 0) goto LAB_00c3e2fb;
    iVar3 = ToPrimitiveImpl<376>(this,result,requestContext);
  }
  bVar5 = iVar3 != 0;
LAB_00c3e2fb:
  return (BOOL)bVar5;
}

Assistant:

BOOL DynamicObject::ToPrimitive(JavascriptHint hint, Var* result, ScriptContext * requestContext)
    {
        if(hint == JavascriptHint::HintString)
        {
            return ToPrimitiveImpl<PropertyIds::toString>(result, requestContext)
                || ToPrimitiveImpl<PropertyIds::valueOf>(result, requestContext);
        }
        else
        {
            Assert(hint == JavascriptHint::None || hint == JavascriptHint::HintNumber);
            return ToPrimitiveImpl<PropertyIds::valueOf>(result, requestContext)
                || ToPrimitiveImpl<PropertyIds::toString>(result, requestContext);

        }
    }